

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::pushHash
          (Dictionary *this,vector<int,_std::allocator<int>_> *hashes,int32_t id)

{
  undefined8 in_RAX;
  size_type sVar1;
  uint *puVar2;
  undefined8 local_28;
  
  local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),id);
  if (-1 < id && this->pruneidx_size_ != 0) {
    if (0 < this->pruneidx_size_) {
      sVar1 = std::
              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(this->pruneidx_)._M_h,(key_type *)&local_28);
      if (sVar1 == 0) {
        return;
      }
      puVar2 = (uint *)std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,(key_type *)&local_28);
      id = *puVar2;
      local_28 = (ulong)(uint)id;
    }
    local_28 = CONCAT44(id + this->nwords_,(key_type)local_28);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(hashes,(int *)((long)&local_28 + 4));
  }
  return;
}

Assistant:

void Dictionary::pushHash(std::vector<int32_t>& hashes, int32_t id) const {
  if (pruneidx_size_ == 0 || id < 0) return;
  if (pruneidx_size_ > 0) {
    if (pruneidx_.count(id)) {
      id = pruneidx_.at(id);
    } else {
      return;
    }
  }
  hashes.push_back(nwords_ + id);
}